

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O0

PixelBufferAccess * __thiscall
rr::MultisamplePixelBufferAccess::toSinglesampleAccess
          (PixelBufferAccess *__return_storage_ptr__,MultisamplePixelBufferAccess *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  TextureFormat *format;
  void *data;
  Vector<int,_3> local_30;
  Vector<int,_3> local_24;
  MultisamplePixelBufferAccess *local_18;
  MultisamplePixelBufferAccess *this_local;
  
  local_18 = this;
  this_local = (MultisamplePixelBufferAccess *)__return_storage_ptr__;
  format = tcu::ConstPixelBufferAccess::getFormat((ConstPixelBufferAccess *)this);
  iVar1 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)this);
  iVar2 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)this);
  tcu::Vector<int,_3>::Vector(&local_24,iVar1,iVar2,1);
  iVar1 = tcu::ConstPixelBufferAccess::getRowPitch((ConstPixelBufferAccess *)this);
  iVar2 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)this);
  iVar3 = tcu::ConstPixelBufferAccess::getSlicePitch((ConstPixelBufferAccess *)this);
  iVar4 = tcu::ConstPixelBufferAccess::getDepth((ConstPixelBufferAccess *)this);
  tcu::Vector<int,_3>::Vector(&local_30,iVar1,iVar2,iVar3 * iVar4);
  data = tcu::PixelBufferAccess::getDataPtr(&this->m_access);
  tcu::PixelBufferAccess::PixelBufferAccess(__return_storage_ptr__,format,&local_24,&local_30,data);
  return __return_storage_ptr__;
}

Assistant:

const tcu::PixelBufferAccess MultisamplePixelBufferAccess::toSinglesampleAccess (void) const
{
	DE_ASSERT(getNumSamples() == 1);

	return tcu::PixelBufferAccess(m_access.getFormat(),
								  tcu::IVec3(m_access.getHeight(), m_access.getDepth(), 1),
								  tcu::IVec3(m_access.getRowPitch(), m_access.getSlicePitch(), m_access.getSlicePitch() * m_access.getDepth()),
								  m_access.getDataPtr());
}